

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall
HighsMipSolverData::limitsToBounds
          (HighsMipSolverData *this,double *dual_bound,double *primal_bound,double *mip_rel_gap)

{
  HighsMipSolver *pHVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = limitsToGap(this,this->lower_bound,this->upper_bound,dual_bound,primal_bound);
  *mip_rel_gap = dVar2;
  pHVar1 = this->mipsolver;
  dVar2 = (pHVar1->options_mip_->super_HighsOptionsStruct).objective_bound;
  dVar3 = *primal_bound;
  if (dVar2 <= *primal_bound) {
    dVar3 = dVar2;
  }
  *primal_bound = dVar3;
  if (pHVar1->orig_model_->sense_ == kMaximize) {
    *dual_bound = -*dual_bound;
    *primal_bound = -*primal_bound;
  }
  return;
}

Assistant:

void HighsMipSolverData::limitsToBounds(double& dual_bound,
                                        double& primal_bound,
                                        double& mip_rel_gap) const {
  mip_rel_gap = limitsToGap(lower_bound, upper_bound, dual_bound, primal_bound);
  primal_bound =
      std::min(mipsolver.options_mip_->objective_bound, primal_bound);
  // Adjust objective sense in case of maximization problem
  if (this->mipsolver.orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound = -dual_bound;
    primal_bound = -primal_bound;
  }
}